

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::FirstState<double>,double,duckdb::FirstFunction<true,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *input_mask_p;
  UnifiedVectorFormat *in_RSI;
  Vector *in_RDI;
  Vector *unaff_retaddr;
  UnifiedVectorFormat idata_2;
  double *idata_1;
  AggregateUnaryInput input_data;
  double *idata;
  idx_t in_stack_ffffffffffffff28;
  AggregateUnaryInput *in_stack_ffffffffffffff30;
  UnifiedVectorFormat *this;
  double *in_stack_ffffffffffffff38;
  UnifiedVectorFormat *in_stack_ffffffffffffff40;
  SelectionVector *in_stack_ffffffffffffff48;
  ValidityMask *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  AggregateInputData *in_stack_ffffffffffffff68;
  SelectionVector *in_stack_ffffffffffffff70;
  data_ptr_t in_stack_ffffffffffffff78;
  FirstState<double> *in_stack_ffffffffffffff80;
  AggregateInputData *in_stack_ffffffffffffff88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  AggregateUnaryInput local_40;
  double *local_28;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  uVar3 = CONCAT13(VVar1,(int3)in_stack_ffffffffffffff60);
  if (VVar1 == FLAT_VECTOR) {
    FlatVector::GetData<double>((Vector *)0xf7f420);
    FlatVector::Validity((Vector *)0xf7f469);
    UnaryFlatUpdateLoop<duckdb::FirstState<double>,double,duckdb::FirstFunction<true,false>>
              ((double *)in_stack_ffffffffffffff90._M_pi,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78,
               (ValidityMask *)in_stack_ffffffffffffff70);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = FirstFunctionBase::IgnoreNull();
    if ((!bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0xf7f39a), !bVar2)) {
      local_28 = ConstantVector::GetData<double>((Vector *)0xf7f3b2);
      input_mask_p = ConstantVector::Validity(in_RDI);
      AggregateUnaryInput::AggregateUnaryInput(&local_40,(AggregateInputData *)in_RSI,input_mask_p);
      FirstFunction<true,false>::
      ConstantOperation<double,duckdb::FirstState<double>,duckdb::FirstFunction<true,false>>
                ((FirstState<double> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  else {
    this = (UnifiedVectorFormat *)&stack0xffffffffffffff70;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff40);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)in_RDI,in_RSI);
    UnifiedVectorFormat::GetData<double>((UnifiedVectorFormat *)&stack0xffffffffffffff70);
    UnaryUpdateLoop<duckdb::FirstState<double>,double,duckdb::FirstFunction<true,false>>
              ((double *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (FirstState<double> *)CONCAT44(in_stack_ffffffffffffff64,uVar3),
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}